

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t varint_to_bytes(uint64_t v,uchar *bytes_out)

{
  size_t sVar1;
  uchar *bytes_out_local;
  uint64_t v_local;
  
  if (v < 0xfd) {
    v_local = uint8_to_le_bytes((uint8_t)v,bytes_out);
  }
  else if (v < 0x10000) {
    *bytes_out = 0xfd;
    sVar1 = uint16_to_le_bytes((uint16_t)v,bytes_out + 1);
    v_local = sVar1 + 1;
  }
  else if (v < 0x100000000) {
    *bytes_out = 0xfe;
    sVar1 = uint32_to_le_bytes((uint32_t)v,bytes_out + 1);
    v_local = sVar1 + 1;
  }
  else {
    *bytes_out = 0xff;
    sVar1 = uint64_to_le_bytes(v,bytes_out + 1);
    v_local = sVar1 + 1;
  }
  return v_local;
}

Assistant:

size_t varint_to_bytes(uint64_t v, unsigned char *bytes_out)
{
    if (v <= VI_MAX_8)
        return uint8_to_le_bytes(v, bytes_out);
    else if (v <= VI_MAX_16) {
        *bytes_out++ = VI_TAG_16;
        return sizeof(uint8_t) + uint16_to_le_bytes(v, bytes_out);
    } else if (v <= VI_MAX_32) {
        *bytes_out++ = VI_TAG_32;
        return sizeof(uint8_t) + uint32_to_le_bytes(v, bytes_out);
    }
    *bytes_out++ = VI_TAG_64;
    return sizeof(uint8_t) + uint64_to_le_bytes(v, bytes_out);
}